

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_time.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  longlong lVar7;
  long lVar8;
  ptime pVar9;
  exception *e;
  ostringstream oss_51;
  ostringstream oss_50;
  ostringstream oss_49;
  tm t_cpy;
  ostringstream oss_48;
  tm t_ref;
  time_t pt;
  longlong top_point;
  longlong low_point;
  longlong range;
  ostringstream oss_47;
  ostringstream oss_46;
  ostringstream oss_45;
  tm mon_3;
  ostringstream oss_44;
  ostringstream oss_43;
  ostringstream oss_42;
  tm mon_2;
  ostringstream oss_41;
  ostringstream oss_40;
  ostringstream oss_39;
  tm mon_1;
  ostringstream oss_38;
  ostringstream oss_37;
  ostringstream oss_36;
  tm mon;
  tm src;
  ostringstream oss_35;
  int diff;
  ptime end;
  ptime start;
  ostringstream oss_34;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  ostringstream oss_29;
  ostringstream oss_28;
  ostringstream oss_27;
  ostringstream oss_26;
  ostringstream oss_25;
  ostringstream oss_24;
  ostringstream oss_23;
  ostringstream oss_22;
  ostringstream oss_21;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  ptime p;
  ptime *in_stack_ffffffffffff9938;
  ptime *in_stack_ffffffffffff9940;
  double in_stack_ffffffffffff9950;
  bool local_6356;
  ptime in_stack_ffffffffffffa428;
  ptime in_stack_ffffffffffffa438;
  ostringstream local_5bb8 [383];
  undefined1 local_5a39;
  string local_5a38 [32];
  ostringstream local_5a18 [383];
  undefined1 local_5899;
  string local_5898 [32];
  ostringstream local_5878 [376];
  tm local_5700;
  undefined1 local_56c1;
  string local_56c0 [32];
  ostringstream local_56a0 [376];
  tm local_5528;
  int local_54f0;
  int local_54ec;
  int local_54e8;
  int local_54e4;
  int local_54e0;
  int local_54dc;
  int local_54d8;
  int local_54d4;
  long local_54b8;
  long local_54b0;
  long local_54a8;
  long local_54a0;
  undefined1 local_5491;
  string local_5490 [32];
  ostringstream local_5470 [383];
  undefined1 local_52f1;
  string local_52f0 [32];
  ostringstream local_52d0 [383];
  undefined1 local_5151;
  string local_5150 [32];
  ostringstream local_5130 [376];
  tm local_4fb8;
  undefined1 local_4f71;
  string local_4f70 [32];
  ostringstream local_4f50 [383];
  undefined1 local_4dd1;
  string local_4dd0 [32];
  ostringstream local_4db0 [383];
  undefined1 local_4c31;
  string local_4c30 [32];
  ostringstream local_4c10 [376];
  tm local_4a98;
  undefined1 local_4a51;
  string local_4a50 [32];
  ostringstream local_4a30 [383];
  undefined1 local_48b1;
  string local_48b0 [32];
  ostringstream local_4890 [383];
  undefined1 local_4711;
  string local_4710 [32];
  ostringstream local_46f0 [376];
  tm local_4578;
  undefined1 local_4531;
  string local_4530 [32];
  ostringstream local_4510 [383];
  undefined1 local_4391;
  string local_4390 [32];
  ostringstream local_4370 [383];
  undefined1 local_41f1;
  string local_41f0 [32];
  ostringstream local_41d0 [376];
  tm local_4058;
  tm local_4018;
  undefined1 local_3fd9;
  string local_3fd8 [32];
  ostringstream local_3fb8 [376];
  longlong local_3e40;
  int local_3e38;
  longlong local_3e30;
  int local_3e28;
  int local_3e1c;
  undefined1 local_3e18 [12];
  undefined1 local_3e08 [12];
  longlong local_3df8;
  int local_3df0;
  ptime local_3de8;
  undefined1 local_3dd8 [12];
  undefined1 local_3dc8 [12];
  undefined1 local_3db1;
  string local_3db0 [32];
  ostringstream local_3d90 [376];
  ptime local_3c18;
  longlong local_3c08;
  int local_3c00;
  ptime local_3bf8;
  longlong local_3be8;
  int local_3be0;
  ptime local_3bd8;
  ptime local_3bc8;
  undefined1 local_3bb1;
  string local_3bb0 [32];
  ostringstream local_3b90 [376];
  longlong local_3a18;
  int local_3a10;
  undefined1 local_39c1;
  string local_39c0 [32];
  ostringstream local_39a0 [376];
  ptime local_3828;
  longlong local_3818;
  int local_3810;
  ptime local_37e8;
  undefined1 local_37d1;
  string local_37d0 [32];
  ostringstream local_37b0 [376];
  ptime local_3638;
  longlong local_3628;
  int local_3620;
  ptime local_35f8;
  undefined1 local_35e1;
  string local_35e0 [32];
  ostringstream local_35c0 [376];
  ptime local_3448;
  longlong local_3438;
  int local_3430;
  ptime local_3408;
  undefined1 local_33f1;
  string local_33f0 [32];
  ostringstream local_33d0 [376];
  ptime local_3258;
  longlong local_3248;
  int local_3240;
  ptime local_3218;
  undefined1 local_3201;
  string local_3200 [32];
  ostringstream local_31e0 [376];
  ptime local_3068;
  longlong local_3058;
  int local_3050;
  ptime local_3028;
  undefined1 local_3011;
  string local_3010 [32];
  ostringstream local_2ff0 [415];
  undefined1 local_2e51;
  string local_2e50 [32];
  ostringstream local_2e30 [415];
  undefined1 local_2c91;
  string local_2c90 [32];
  ostringstream local_2c70 [376];
  ptime local_2af8;
  ptime local_2ae8;
  undefined1 local_2ad1;
  string local_2ad0 [32];
  ostringstream local_2ab0 [415];
  undefined1 local_2911;
  string local_2910 [32];
  ostringstream local_28f0 [415];
  undefined1 local_2751;
  string local_2750 [32];
  ostringstream local_2730 [415];
  undefined1 local_2591;
  string local_2590 [32];
  ostringstream local_2570 [376];
  longlong local_23f8;
  int local_23f0;
  undefined1 local_23e1;
  string local_23e0 [32];
  ostringstream local_23c0 [376];
  longlong local_2248;
  int local_2240;
  undefined1 local_2231;
  string local_2230 [32];
  ostringstream local_2210 [376];
  longlong local_2098;
  int local_2090;
  undefined1 local_2081;
  string local_2080 [32];
  ostringstream local_2060 [376];
  longlong local_1ee8;
  int local_1ee0;
  undefined1 local_1ed1;
  string local_1ed0 [32];
  ostringstream local_1eb0 [376];
  longlong local_1d38;
  int local_1d30;
  undefined1 local_1d21;
  string local_1d20 [32];
  ostringstream local_1d00 [376];
  ptime local_1b88;
  longlong local_1b78;
  int local_1b70;
  longlong local_1b68;
  int local_1b60;
  undefined1 local_1b51;
  string local_1b50 [32];
  ostringstream local_1b30 [376];
  ptime local_19b8;
  longlong local_19a8;
  int local_19a0;
  longlong local_1998;
  int local_1990;
  undefined1 local_1981;
  string local_1980 [32];
  ostringstream local_1960 [376];
  ptime local_17e8;
  longlong local_17d8;
  int local_17d0;
  longlong local_17c8;
  int local_17c0;
  undefined1 local_17b1;
  string local_17b0 [32];
  ostringstream local_1790 [376];
  ptime local_1618;
  longlong local_1608;
  int local_1600;
  longlong local_15f8;
  int local_15f0;
  undefined1 local_15e1;
  string local_15e0 [32];
  ostringstream local_15c0 [376];
  longlong local_1448;
  int local_1440;
  longlong local_1438;
  int local_1430;
  undefined1 local_1421;
  string local_1420 [32];
  ostringstream local_1400 [383];
  undefined1 local_1281;
  string local_1280 [32];
  ostringstream local_1260 [383];
  undefined1 local_10e1;
  string local_10e0 [32];
  ostringstream local_10c0 [376];
  longlong local_f48;
  int local_f40;
  longlong local_f38;
  int local_f30;
  undefined1 local_f21;
  string local_f20 [32];
  ostringstream local_f00 [383];
  undefined1 local_d81;
  string local_d80 [32];
  ostringstream local_d60 [383];
  undefined1 local_be1;
  string local_be0 [32];
  ostringstream local_bc0 [376];
  longlong local_a48;
  int local_a40;
  longlong local_a38;
  int local_a30;
  undefined1 local_a21;
  string local_a20 [32];
  ostringstream local_a00 [383];
  undefined1 local_881;
  string local_880 [32];
  ostringstream local_860 [376];
  ptime local_6e8;
  longlong local_6d8;
  int local_6d0;
  undefined1 local_6c1;
  string local_6c0 [32];
  ostringstream local_6a0 [383];
  undefined1 local_521;
  string local_520 [32];
  ostringstream local_500 [376];
  ptime local_388;
  longlong local_378;
  int local_370;
  undefined1 local_361;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  ptime local_28 [2];
  int local_4;
  
  local_4 = 0;
  poVar5 = std::operator<<((ostream *)&std::cout,"- Testing ptime");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(local_28,(ptime *)&booster::ptime::zero);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar5 = std::operator<<((ostream *)local_1a0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x20);
    std::operator<<(poVar5," p==ptime::zero");
    local_1c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1c0);
    local_1c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar5 = std::operator<<((ostream *)local_340,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x21);
    std::operator<<(poVar5," p.get_seconds()==0 && p.get_nanoseconds()==0");
    local_361 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_360);
    local_361 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_378;
  local_28[0].nsec = local_370;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(local_28,&local_388);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_500);
    poVar5 = std::operator<<((ostream *)local_500,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x23);
    std::operator<<(poVar5," p==ptime(10,20)");
    local_521 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_520);
    local_521 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 10) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 0x14)) {
    std::__cxx11::ostringstream::ostringstream(local_6a0);
    poVar5 = std::operator<<((ostream *)local_6a0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x24);
    std::operator<<(poVar5," p.get_seconds()==10 && p.get_nanoseconds()==20");
    local_6c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_6c0);
    local_6c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_6d8;
  local_28[0].nsec = local_6d0;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(local_28,&local_6e8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_860);
    poVar5 = std::operator<<((ostream *)local_860,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x27);
    std::operator<<(poVar5," p==ptime(15,0)");
    local_881 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_880);
    local_881 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0xf) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_a00);
    poVar5 = std::operator<<((ostream *)local_a00,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x28);
    std::operator<<(poVar5," p.get_seconds()==15 && p.get_nanoseconds()==0");
    local_a21 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_a20);
    local_a21 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffff9940);
  local_a48 = pVar9.sec;
  local_a40 = pVar9.nsec;
  local_a38 = local_a48;
  local_a30 = local_a40;
  local_28[0].sec = local_a48;
  local_28[0].nsec = local_a40;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 2) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 100000000)) {
    std::__cxx11::ostringstream::ostringstream(local_bc0);
    poVar5 = std::operator<<((ostream *)local_bc0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c);
    std::operator<<(poVar5," p.get_seconds()==2 && p.get_nanoseconds() == 100000000");
    local_be1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_be0);
    local_be1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = booster::ptime::milliseconds(in_stack_ffffffffffff9940);
  if (lVar7 != 0x834) {
    std::__cxx11::ostringstream::ostringstream(local_d60);
    poVar5 = std::operator<<((ostream *)local_d60,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2d);
    std::operator<<(poVar5," ptime::milliseconds(p)==2100");
    local_d81 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_d80);
    local_d81 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = booster::ptime::get_milliseconds(local_28);
  if (iVar4 != 100) {
    std::__cxx11::ostringstream::ostringstream(local_f00);
    poVar5 = std::operator<<((ostream *)local_f00,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2e);
    std::operator<<(poVar5," p.get_milliseconds()==100");
    local_f21 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_f20);
    local_f21 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::microseconds((longlong)in_stack_ffffffffffff9940);
  local_f48 = pVar9.sec;
  local_f40 = pVar9.nsec;
  local_f38 = local_f48;
  local_f30 = local_f40;
  local_28[0].sec = local_f48;
  local_28[0].nsec = local_f40;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 3) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 230000000)) {
    std::__cxx11::ostringstream::ostringstream(local_10c0);
    poVar5 = std::operator<<((ostream *)local_10c0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30);
    std::operator<<(poVar5," p.get_seconds() == 3 && p.get_nanoseconds() == 230000000");
    local_10e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_10e0);
    local_10e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = booster::ptime::microseconds(in_stack_ffffffffffff9940);
  if (lVar7 != 0x314930) {
    std::__cxx11::ostringstream::ostringstream(local_1260);
    poVar5 = std::operator<<((ostream *)local_1260,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x31);
    std::operator<<(poVar5," ptime::microseconds(p)==3230000");
    local_1281 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1280);
    local_1281 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar4 = booster::ptime::get_microseconds(local_28);
  if (iVar4 != 230000) {
    std::__cxx11::ostringstream::ostringstream(local_1400);
    poVar5 = std::operator<<((ostream *)local_1400,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x32);
    std::operator<<(poVar5," p.get_microseconds()==230000");
    local_1421 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1420);
    local_1421 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::nanoseconds(0x1043d2);
  local_1448 = pVar9.sec;
  local_1440 = pVar9.nsec;
  local_1438 = local_1448;
  local_1430 = local_1440;
  local_28[0].sec = local_1448;
  local_28[0].nsec = local_1440;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 1) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 100)) {
    std::__cxx11::ostringstream::ostringstream(local_15c0);
    poVar5 = std::operator<<((ostream *)local_15c0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x34);
    std::operator<<(poVar5," p.get_seconds()==1 && p.get_nanoseconds() == 100");
    local_15e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_15e0);
    local_15e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::seconds(0x104618);
  local_1608 = pVar9.sec;
  local_1600 = pVar9.nsec;
  local_15f8 = local_1608;
  local_15f0 = local_1600;
  local_28[0].sec = local_1608;
  local_28[0].nsec = local_1600;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar3 = booster::ptime::operator==(local_28,&local_1618);
  bVar2 = false;
  if (bVar3) {
    lVar7 = booster::ptime::seconds(local_28);
    bVar2 = lVar7 == 0xf;
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1790);
    poVar5 = std::operator<<((ostream *)local_1790,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x36);
    std::operator<<(poVar5," p==ptime(15) && ptime::seconds(p)==15");
    local_17b1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_17b0);
    local_17b1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::minutes(0x10489c);
  local_17d8 = pVar9.sec;
  local_17d0 = pVar9.nsec;
  local_17c8 = local_17d8;
  local_17c0 = local_17d0;
  local_28[0].sec = local_17d8;
  local_28[0].nsec = local_17d0;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar3 = booster::ptime::operator==(local_28,&local_17e8);
  bVar2 = false;
  if (bVar3) {
    lVar7 = booster::ptime::minutes((ptime *)0x10495f);
    bVar2 = lVar7 == 0xf;
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1960);
    poVar5 = std::operator<<((ostream *)local_1960,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x38);
    std::operator<<(poVar5," p==ptime(15*60) && ptime::minutes(p)==15");
    local_1981 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1980);
    local_1981 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::hours(0x104b20);
  local_19a8 = pVar9.sec;
  local_19a0 = pVar9.nsec;
  local_1998 = local_19a8;
  local_1990 = local_19a0;
  local_28[0].sec = local_19a8;
  local_28[0].nsec = local_19a0;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar3 = booster::ptime::operator==(local_28,&local_19b8);
  bVar2 = false;
  if (bVar3) {
    lVar7 = booster::ptime::hours((ptime *)0x104be3);
    bVar2 = lVar7 == 0xf;
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b30);
    poVar5 = std::operator<<((ostream *)local_1b30,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3a);
    std::operator<<(poVar5," p==ptime(15*3600) && ptime::hours(p)==15");
    local_1b51 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1b50);
    local_1b51 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9 = booster::ptime::days(0x104da4);
  local_1b78 = pVar9.sec;
  local_1b70 = pVar9.nsec;
  local_1b68 = local_1b78;
  local_1b60 = local_1b70;
  local_28[0].sec = local_1b78;
  local_28[0].nsec = local_1b70;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar3 = booster::ptime::operator==(local_28,&local_1b88);
  bVar2 = false;
  if (bVar3) {
    lVar7 = booster::ptime::days((ptime *)0x104e67);
    bVar2 = lVar7 == 0xf;
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1d00);
    poVar5 = std::operator<<((ostream *)local_1d00,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3c);
    std::operator<<(poVar5," p==ptime(15*3600*24) && ptime::days(p)==15");
    local_1d21 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1d20);
    local_1d21 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_1d38;
  local_28[0].nsec = local_1d30;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0x65) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 1)) {
    std::__cxx11::ostringstream::ostringstream(local_1eb0);
    poVar5 = std::operator<<((ostream *)local_1eb0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x3f);
    std::operator<<(poVar5," p.get_seconds()==101 && p.get_nanoseconds()==1");
    local_1ed1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1ed0);
    local_1ed1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_1ee8;
  local_28[0].nsec = local_1ee0;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0x66) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 1)) {
    std::__cxx11::ostringstream::ostringstream(local_2060);
    poVar5 = std::operator<<((ostream *)local_2060,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x42);
    std::operator<<(poVar5," p.get_seconds()==102 && p.get_nanoseconds()==1");
    local_2081 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2080);
    local_2081 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_2098;
  local_28[0].nsec = local_2090;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0x66) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_2210);
    poVar5 = std::operator<<((ostream *)local_2210,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x45);
    std::operator<<(poVar5," p.get_seconds()==102 && p.get_nanoseconds()==0");
    local_2231 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2230);
    local_2231 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_2248;
  local_28[0].nsec = local_2240;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 99) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 1)) {
    std::__cxx11::ostringstream::ostringstream(local_23c0);
    poVar5 = std::operator<<((ostream *)local_23c0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x48);
    std::operator<<(poVar5," p.get_seconds()==99 && p.get_nanoseconds()==1");
    local_23e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_23e0);
    local_23e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_23f8;
  local_28[0].nsec = local_23f0;
  lVar7 = booster::ptime::get_seconds(local_28);
  if ((lVar7 != 0x62) || (iVar4 = booster::ptime::get_nanoseconds(local_28), iVar4 != 2)) {
    std::__cxx11::ostringstream::ostringstream(local_2570);
    poVar5 = std::operator<<((ostream *)local_2570,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4b);
    std::operator<<(poVar5," p.get_seconds()==98 && p.get_nanoseconds()==2");
    local_2591 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2590);
    local_2591 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator!=(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2730);
    poVar5 = std::operator<<((ostream *)local_2730,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4d);
    std::operator<<(poVar5," ptime(100,0)!=ptime(101,0)");
    local_2751 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2750);
    local_2751 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator!=(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_28f0);
    poVar5 = std::operator<<((ostream *)local_28f0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4e);
    std::operator<<(poVar5," ptime(100,1)!=ptime(100,0)");
    local_2911 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2910);
    local_2911 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator!=(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2ab0);
    poVar5 = std::operator<<((ostream *)local_2ab0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
    std::operator<<(poVar5," ptime(101,1)!=ptime(100,0)");
    local_2ad1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2ad0);
    local_2ad1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_2ae8,&local_2af8);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2c70);
    poVar5 = std::operator<<((ostream *)local_2c70,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
    std::operator<<(poVar5," ptime(100,3)==ptime(100,3)");
    local_2c91 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2c90);
    local_2c91 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator<=(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2e30);
    poVar5 = std::operator<<((ostream *)local_2e30,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x51);
    std::operator<<(poVar5," ptime(100,3)<=ptime(100,3)");
    local_2e51 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_2e50);
    local_2e51 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator>=(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_2ff0);
    poVar5 = std::operator<<((ostream *)local_2ff0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x52);
    std::operator<<(poVar5," ptime(100,3)>=ptime(100,3)");
    local_3011 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3010);
    local_3011 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::operator+(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3058 = pVar9.sec;
  local_3050 = pVar9.nsec;
  local_3028.sec = local_3058;
  local_3028.nsec = local_3050;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_3028,&local_3068);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_31e0);
    poVar5 = std::operator<<((ostream *)local_31e0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x54);
    std::operator<<(poVar5," ptime(100,2)+ptime(101,3)==ptime(201,5)");
    local_3201 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3200);
    local_3201 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::operator+(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3248 = pVar9.sec;
  local_3240 = pVar9.nsec;
  local_3218.sec = local_3248;
  local_3218.nsec = local_3240;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_3218,&local_3258);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_33d0);
    poVar5 = std::operator<<((ostream *)local_33d0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x55);
    std::operator<<(poVar5," ptime(100,2)+ptime(1,999999999)==ptime(102,1)");
    local_33f1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_33f0);
    local_33f1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::operator-(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3438 = pVar9.sec;
  local_3430 = pVar9.nsec;
  local_3408.sec = local_3438;
  local_3408.nsec = local_3430;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_3408,&local_3448);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_35c0);
    poVar5 = std::operator<<((ostream *)local_35c0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x56);
    std::operator<<(poVar5," ptime(100,0)-ptime(1,1)==ptime(98,999999999)");
    local_35e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_35e0);
    local_35e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::operator-(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3628 = pVar9.sec;
  local_3620 = pVar9.nsec;
  local_35f8.sec = local_3628;
  local_35f8.nsec = local_3620;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_35f8,&local_3638);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_37b0);
    poVar5 = std::operator<<((ostream *)local_37b0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x57);
    std::operator<<(poVar5," ptime(100,0)-ptime(0,999999999)==ptime(99,1)");
    local_37d1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_37d0);
    local_37d1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::operator-(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3818 = pVar9.sec;
  local_3810 = pVar9.nsec;
  local_37e8.sec = local_3818;
  local_37e8.nsec = local_3810;
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  bVar2 = booster::ptime::operator==(&local_37e8,&local_3828);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_39a0);
    poVar5 = std::operator<<((ostream *)local_39a0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x58);
    std::operator<<(poVar5," ptime(100,10)-ptime(1,5)==ptime(99,5)");
    local_39c1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_39c0);
    local_39c1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  test_lower(in_stack_ffffffffffffa438,in_stack_ffffffffffffa428);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  test_lower(in_stack_ffffffffffffa438,in_stack_ffffffffffffa428);
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  local_28[0].sec = local_3a18;
  local_28[0].nsec = local_3a10;
  dVar1 = booster::ptime::to_number(local_28);
  if ((dVar1 <= 10.099999) || (dVar1 = booster::ptime::to_number(local_28), 10.10001 <= dVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_3b90);
    poVar5 = std::operator<<((ostream *)local_3b90,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d);
    std::operator<<(poVar5," 10.099999 < ptime::to_number(p) && ptime::to_number(p) < 10.10001");
    local_3bb1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3bb0);
    local_3bb1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
  pVar9 = booster::ptime::from_number(in_stack_ffffffffffff9950);
  local_3be8 = pVar9.sec;
  local_3be0 = pVar9.nsec;
  local_3bd8.sec = local_3be8;
  local_3bd8.nsec = local_3be0;
  bVar2 = booster::ptime::operator<(&local_3bc8,&local_3bd8);
  local_6356 = false;
  if (bVar2) {
    pVar9 = booster::ptime::from_number(in_stack_ffffffffffff9950);
    local_3c08 = pVar9.sec;
    local_3c00 = pVar9.nsec;
    local_3bf8.sec = local_3c08;
    local_3bf8.nsec = local_3c00;
    booster::ptime::ptime(in_stack_ffffffffffff9940,(longlong)in_stack_ffffffffffff9938,0);
    local_6356 = booster::ptime::operator<(&local_3bf8,&local_3c18);
  }
  if (local_6356 == false) {
    std::__cxx11::ostringstream::ostringstream(local_3d90);
    poVar5 = std::operator<<((ostream *)local_3d90,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5e);
    std::operator<<(poVar5,
                    " ptime(10, 9999990) < ptime::from_number(10.1) && ptime::from_number(10.1) <ptime(10,100000010)"
                   );
    local_3db1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3db0);
    local_3db1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3dd8 = booster::ptime::now();
  local_3dc8 = local_3dd8;
  pVar9 = booster::ptime::milliseconds((longlong)in_stack_ffffffffffff9940);
  local_3df8 = pVar9.sec;
  local_3df0 = pVar9.nsec;
  local_3de8.sec = local_3df8;
  local_3de8.nsec = local_3df0;
  booster::ptime::sleep(&local_3de8);
  local_3e18 = booster::ptime::now();
  local_3e08 = local_3e18;
  pVar9 = booster::ptime::operator-(in_stack_ffffffffffff9940,in_stack_ffffffffffff9938);
  local_3e40 = pVar9.sec;
  local_3e38 = pVar9.nsec;
  local_3e30 = local_3e40;
  local_3e28 = local_3e38;
  lVar7 = booster::ptime::milliseconds(in_stack_ffffffffffff9940);
  local_3e1c = (int)lVar7;
  if ((local_3e1c < 100) || (300 < local_3e1c)) {
    std::__cxx11::ostringstream::ostringstream(local_3fb8);
    poVar5 = std::operator<<((ostream *)local_3fb8,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,100);
    std::operator<<(poVar5," 100 <= diff && diff <=300");
    local_3fd9 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_3fd8);
    local_3fd9 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"- Testing ctime");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"- Testing timegm normalization");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_4018.tm_isdst = 0;
  local_4018._36_4_ = 0;
  local_4018.tm_gmtoff = 0;
  local_4018.tm_wday = 0;
  local_4018.tm_yday = 0;
  local_4018.tm_sec = 0;
  local_4018.tm_min = 0;
  local_4018.tm_zone = (char *)0x0;
  local_4018.tm_hour = 0;
  local_4018.tm_mday = 0xe;
  local_4018.tm_year = 0x6f;
  local_4018.tm_mon = 1;
  local_4058.tm_zone = (char *)0x0;
  local_4058.tm_isdst = 0;
  local_4058._36_4_ = 0;
  local_4058.tm_gmtoff = 0;
  local_4058.tm_wday = 0;
  local_4058.tm_yday = 0;
  local_4058.tm_sec = 0;
  local_4058.tm_min = 0;
  local_4058.tm_hour = 0;
  local_4058.tm_mday = 0xe;
  local_4058.tm_mon = 0xe;
  local_4058.tm_year = 0x6f;
  booster::normalize_universal_time(&local_4058);
  if (local_4058.tm_mon != 2) {
    std::__cxx11::ostringstream::ostringstream(local_41d0);
    poVar5 = std::operator<<((ostream *)local_41d0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x72);
    std::operator<<(poVar5," mon.tm_mon == 2");
    local_41f1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_41f0);
    local_41f1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4058.tm_year != 0x70) {
    std::__cxx11::ostringstream::ostringstream(local_4370);
    poVar5 = std::operator<<((ostream *)local_4370,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x73);
    std::operator<<(poVar5," mon.tm_year == 2012 - 1900");
    local_4391 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4390);
    local_4391 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4058.tm_mday != 0xe) {
    std::__cxx11::ostringstream::ostringstream(local_4510);
    poVar5 = std::operator<<((ostream *)local_4510,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x74);
    std::operator<<(poVar5," mon.tm_mday == 14");
    local_4531 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4530);
    local_4531 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_4578.tm_zone = local_4018.tm_zone;
  local_4578.tm_isdst = local_4018.tm_isdst;
  local_4578._36_4_ = local_4018._36_4_;
  local_4578.tm_gmtoff = local_4018.tm_gmtoff;
  local_4578.tm_wday = local_4018.tm_wday;
  local_4578.tm_yday = local_4018.tm_yday;
  local_4578.tm_sec = local_4018.tm_sec;
  local_4578.tm_min = local_4018.tm_min;
  local_4578.tm_hour = local_4018.tm_hour;
  local_4578.tm_mday = local_4018.tm_mday;
  local_4578.tm_mon = local_4018.tm_mon + -0x18;
  local_4578.tm_year = local_4018.tm_year;
  booster::normalize_universal_time(&local_4578);
  if (local_4578.tm_mon != 1) {
    std::__cxx11::ostringstream::ostringstream(local_46f0);
    poVar5 = std::operator<<((ostream *)local_46f0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7a);
    std::operator<<(poVar5," mon.tm_mon == 1");
    local_4711 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4710);
    local_4711 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4578.tm_year != 0x6d) {
    std::__cxx11::ostringstream::ostringstream(local_4890);
    poVar5 = std::operator<<((ostream *)local_4890,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7b);
    std::operator<<(poVar5," mon.tm_year == 2009 - 1900");
    local_48b1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_48b0);
    local_48b1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4578.tm_mday != 0xe) {
    std::__cxx11::ostringstream::ostringstream(local_4a30);
    poVar5 = std::operator<<((ostream *)local_4a30,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7c);
    std::operator<<(poVar5," mon.tm_mday == 14");
    local_4a51 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4a50);
    local_4a51 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_4a98.tm_zone = local_4018.tm_zone;
  local_4a98.tm_isdst = local_4018.tm_isdst;
  local_4a98._36_4_ = local_4018._36_4_;
  local_4a98.tm_gmtoff = local_4018.tm_gmtoff;
  local_4a98.tm_mon = local_4018.tm_mon;
  local_4a98.tm_year = local_4018.tm_year;
  local_4a98.tm_wday = local_4018.tm_wday;
  local_4a98.tm_yday = local_4018.tm_yday;
  local_4a98.tm_sec = local_4018.tm_sec;
  local_4a98.tm_min = local_4018.tm_min;
  local_4a98.tm_mday = local_4018.tm_mday + 0xf;
  local_4a98.tm_hour = local_4018.tm_hour;
  booster::normalize_universal_time(&local_4a98);
  if (local_4a98.tm_mon != 2) {
    std::__cxx11::ostringstream::ostringstream(local_4c10);
    poVar5 = std::operator<<((ostream *)local_4c10,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x82);
    std::operator<<(poVar5," mon.tm_mon == 2");
    local_4c31 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4c30);
    local_4c31 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4a98.tm_year != 0x6f) {
    std::__cxx11::ostringstream::ostringstream(local_4db0);
    poVar5 = std::operator<<((ostream *)local_4db0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
    std::operator<<(poVar5," mon.tm_year == 2011 - 1900");
    local_4dd1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4dd0);
    local_4dd1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4a98.tm_mday != 1) {
    std::__cxx11::ostringstream::ostringstream(local_4f50);
    poVar5 = std::operator<<((ostream *)local_4f50,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x84);
    std::operator<<(poVar5," mon.tm_mday == 1");
    local_4f71 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_4f70);
    local_4f71 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_4fb8.tm_zone = local_4018.tm_zone;
  local_4fb8.tm_isdst = local_4018.tm_isdst;
  local_4fb8._36_4_ = local_4018._36_4_;
  local_4fb8.tm_gmtoff = local_4018.tm_gmtoff;
  local_4fb8.tm_wday = local_4018.tm_wday;
  local_4fb8.tm_yday = local_4018.tm_yday;
  local_4fb8.tm_sec = local_4018.tm_sec;
  local_4fb8.tm_min = local_4018.tm_min;
  local_4fb8.tm_mon = local_4018.tm_mon;
  local_4fb8.tm_year = 100;
  local_4fb8.tm_mday = local_4018.tm_mday + 0xf;
  local_4fb8.tm_hour = local_4018.tm_hour;
  booster::normalize_universal_time(&local_4fb8);
  if (local_4fb8.tm_mon != 1) {
    std::__cxx11::ostringstream::ostringstream(local_5130);
    poVar5 = std::operator<<((ostream *)local_5130,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
    std::operator<<(poVar5," mon.tm_mon == 1");
    local_5151 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_5150);
    local_5151 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4fb8.tm_year != 100) {
    std::__cxx11::ostringstream::ostringstream(local_52d0);
    poVar5 = std::operator<<((ostream *)local_52d0,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8c);
    std::operator<<(poVar5," mon.tm_year == 2000 - 1900");
    local_52f1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_52f0);
    local_52f1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4fb8.tm_mday != 0x1d) {
    std::__cxx11::ostringstream::ostringstream(local_5470);
    poVar5 = std::operator<<((ostream *)local_5470,"Error ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
    std::operator<<(poVar5," mon.tm_mday == 29");
    local_5491 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_5490);
    local_5491 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"- Testing timegm implementation");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_54a0 = 0x3ae6bc400;
  lVar8 = std::numeric_limits<long>::max();
  if (lVar8 < 0x3ae6bc400) {
    local_54a0 = std::numeric_limits<long>::max();
    local_54a0 = local_54a0 + -0x15180;
  }
  local_54b8 = -local_54a0;
  local_54b0 = local_54a0;
  local_54a8 = local_54b8;
  while( true ) {
    if (local_54b0 <= local_54b8) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return local_4;
    }
    booster::universal_time((long)&local_54f0);
    booster::universal_time((long)&local_5528);
    lVar8 = booster::make_universal_time(&local_5528);
    if (lVar8 != local_54b8) {
      std::__cxx11::ostringstream::ostringstream(local_56a0);
      poVar5 = std::operator<<((ostream *)local_56a0,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa1);
      std::operator<<(poVar5," booster::make_universal_time(booster::universal_time(pt)) == pt");
      local_56c1 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_56c0);
      local_56c1 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    memset(&local_5700,0,0x38);
    local_5700.tm_year = local_54dc;
    local_5700.tm_mon = local_54e0;
    local_5700.tm_mday = local_54e4;
    local_5700.tm_hour = local_54e8;
    local_5700.tm_min = local_54ec;
    local_5700.tm_sec = local_54f0;
    local_5700.tm_isdst = -1;
    lVar8 = booster::normalize_universal_time(&local_5700);
    if (lVar8 != local_54b8) {
      std::__cxx11::ostringstream::ostringstream(local_5878);
      poVar5 = std::operator<<((ostream *)local_5878,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaa);
      std::operator<<(poVar5," booster::normalize_universal_time(t_cpy) == pt");
      local_5899 = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,local_5898);
      local_5899 = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_5700.tm_wday != local_54d8) break;
    if (local_5700.tm_yday != local_54d4) {
      std::__cxx11::ostringstream::ostringstream(local_5bb8);
      poVar5 = std::operator<<((ostream *)local_5bb8,"Error ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xac);
      std::operator<<(poVar5," t_cpy.tm_yday == t_ref.tm_yday");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar6,(string *)&stack0xffffffffffffa428);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_54b8 = local_54b8 + 0xa8c0;
  }
  std::__cxx11::ostringstream::ostringstream(local_5a18);
  poVar5 = std::operator<<((ostream *)local_5a18,"Error ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/ptime/test/test_posix_time.cpp"
                          );
  poVar5 = std::operator<<(poVar5,":");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xab);
  std::operator<<(poVar5," t_cpy.tm_wday == t_ref.tm_wday");
  local_5a39 = 1;
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar6,local_5a38);
  local_5a39 = 0;
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		using booster::ptime;

		std::cout << "- Testing ptime" << std::endl;
		ptime p;
		TEST(p==ptime::zero);
		TEST(p.get_seconds()==0 && p.get_nanoseconds()==0);
		p=ptime(10,20);
		TEST(p==ptime(10,20));
		TEST(p.get_seconds()==10 && p.get_nanoseconds()==20);
		
		p=ptime(15);
		TEST(p==ptime(15,0));
		TEST(p.get_seconds()==15 && p.get_nanoseconds()==0);


		p=ptime::milliseconds(2100);
		TEST(p.get_seconds()==2 && p.get_nanoseconds() == 100000000);
		TEST(ptime::milliseconds(p)==2100);
		TEST(p.get_milliseconds()==100);
		p=ptime::microseconds(3230000);
		TEST(p.get_seconds() == 3 && p.get_nanoseconds() == 230000000);
		TEST(ptime::microseconds(p)==3230000);
		TEST(p.get_microseconds()==230000);
		p=ptime::nanoseconds(1000000100);
		TEST(p.get_seconds()==1 && p.get_nanoseconds() == 100);
		p=ptime::seconds(15);
		TEST(p==ptime(15) && ptime::seconds(p)==15);
		p=ptime::minutes(15);
		TEST(p==ptime(15*60) && ptime::minutes(p)==15);
		p=ptime::hours(15);
		TEST(p==ptime(15*3600) && ptime::hours(p)==15);
		p=ptime::days(15);
		TEST(p==ptime(15*3600*24) && ptime::days(p)==15);
		
		p=ptime(100,1000000001);
		TEST(p.get_seconds()==101 && p.get_nanoseconds()==1);
		
		p=ptime(100,2000000001);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==1);

		p=ptime(100,2000000000);
		TEST(p.get_seconds()==102 && p.get_nanoseconds()==0);
		
		p=ptime(100,-999999999);
		TEST(p.get_seconds()==99 && p.get_nanoseconds()==1);
		
		p=ptime(100,-1999999998);
		TEST(p.get_seconds()==98 && p.get_nanoseconds()==2);

		TEST(ptime(100,0)!=ptime(101,0));
		TEST(ptime(100,1)!=ptime(100,0));
		TEST(ptime(101,1)!=ptime(100,0));
		TEST(ptime(100,3)==ptime(100,3));
		TEST(ptime(100,3)<=ptime(100,3));
		TEST(ptime(100,3)>=ptime(100,3));

		TEST(ptime(100,2)+ptime(101,3)==ptime(201,5));
		TEST(ptime(100,2)+ptime(1,999999999)==ptime(102,1));
		TEST(ptime(100,0)-ptime(1,1)==ptime(98,999999999));
		TEST(ptime(100,0)-ptime(0,999999999)==ptime(99,1));
		TEST(ptime(100,10)-ptime(1,5)==ptime(99,5));

		test_lower(ptime(100,0),ptime(101,0));
		test_lower(ptime(100,0),ptime(100,1));
		p=ptime(10,100000000);
		TEST(10.099999 < ptime::to_number(p) && ptime::to_number(p) < 10.10001);
		TEST(ptime(10, 9999990) < ptime::from_number(10.1) && ptime::from_number(10.1) <ptime(10,100000010));

		ptime start=ptime::now();
		ptime::sleep(ptime::milliseconds(100));
		ptime end = ptime::now();
		int diff = ptime::milliseconds(end-start);
		TEST(100 <= diff && diff <=300);

		std::cout << "- Testing ctime" << std::endl;
		std::cout << "- Testing timegm normalization" << std::endl;	
	
		std::tm src = std::tm();
		src.tm_year = 2011 - 1900;
		src.tm_mday = 14;
		src.tm_mon = 1; // feb

		{
			std::tm mon=src;
			mon.tm_mon+=13;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2012 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mon-=24;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2009 - 1900);
			TEST(mon.tm_mday == 14);
		}
		{
			std::tm mon=src;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 2);
			TEST(mon.tm_year == 2011 - 1900);
			TEST(mon.tm_mday == 1);
		}
		{
			std::tm mon=src;
			mon.tm_year = 2000 - 1900;
			mon.tm_mday+=15;
			booster::normalize_universal_time(mon);
			TEST(mon.tm_mon == 1);
			TEST(mon.tm_year == 2000 - 1900);
			TEST(mon.tm_mday == 29);
		}
	
		std::cout << "- Testing timegm implementation" << std::endl;	
		long long range = 500LL * 3600 * 24 * 366;
		if(range > std::numeric_limits<time_t>::max()) {
			range = std::numeric_limits<time_t>::max() - 3600 * 24;
		}
#ifdef BOOSTER_WIN_NATIVE
		// Under Windows localtime and gmtime are valid for positive time_t values
		// only
		long long low_point = 0;
#else
		long long low_point = -range;
#endif
		long long top_point = +range;

		for(time_t pt = low_point;pt < top_point;pt+=3600 * 12) {
			// One is system other is mine
			std::tm t_ref = booster::universal_time(pt);
			TEST(booster::make_universal_time(booster::universal_time(pt)) == pt);
			std::tm t_cpy = std::tm();
			t_cpy.tm_year = t_ref.tm_year;
			t_cpy.tm_mon = t_ref.tm_mon;
			t_cpy.tm_mday = t_ref.tm_mday;
			t_cpy.tm_hour = t_ref.tm_hour;
			t_cpy.tm_min = t_ref.tm_min;
			t_cpy.tm_sec = t_ref.tm_sec;
			t_cpy.tm_isdst = -1;
			TEST(booster::normalize_universal_time(t_cpy) == pt);
			TEST(t_cpy.tm_wday == t_ref.tm_wday);
			TEST(t_cpy.tm_yday == t_ref.tm_yday);
		}



	}
	catch(std::exception const &e) {
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
}